

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseexc.hpp
# Opt level: O3

void __thiscall MetaSim::BaseExc::BaseExc(BaseExc *this,string *message,string *cl,string *md)

{
  ostream *poVar1;
  stringstream ss;
  long *local_1e8 [2];
  long local_1d8 [2];
  runtime_error local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::runtime_error::runtime_error(&this->super_runtime_error,"");
  *(undefined ***)this = &PTR__BaseExc_0017cb98;
  (this->_what)._M_dataplus._M_p = (pointer)&(this->_what).field_2;
  (this->_what)._M_string_length = 0;
  (this->_what).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Class=",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(cl->_M_dataplus)._M_p,cl->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Module=",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(md->_M_dataplus)._M_p,md->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Message:",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(local_1c8,(string *)local_1e8);
  std::runtime_error::operator=(&this->super_runtime_error,local_1c8);
  std::runtime_error::~runtime_error(local_1c8);
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

BaseExc(const std::string &message,
                const std::string &cl="unknown",
                const std::string &md="unknown") :
          std::runtime_error("")
              {
                  std::stringstream ss;
                  ss << "Class=" << cl
                     << " Module=" << md
                     << " Message:" << message;
                  static_cast<std::runtime_error&>(*this) = std::runtime_error(ss.str());
              }